

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

size_t ssh2_stdin_backlog(ConnectionLayer *cl)

{
  ConnectionLayerVtable *pCVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (cl[-0xc].logctx != (LogContext *)0x0) {
    pCVar1 = cl[-0xc].vt;
    sVar2 = bufchain_size((bufchain *)&pCVar1[-1].add_sharing_x11_display);
    sVar3 = bufchain_size((bufchain *)&pCVar1[-1].sharing_queue_global_request);
    return sVar3 + sVar2;
  }
  return 0;
}

Assistant:

static size_t ssh2_stdin_backlog(ConnectionLayer *cl)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh2_channel *c;

    if (!s->mainchan)
        return 0;
    c = container_of(s->mainchan_sc, struct ssh2_channel, sc);
    return s->mainchan ?
        bufchain_size(&c->outbuffer) + bufchain_size(&c->errbuffer) : 0;
}